

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hand.cpp
# Opt level: O1

void __thiscall
Hand::Hand(Hand *this,vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *contour,
          bool shouldCheckSize,bool shouldCheckAngles,bool shouldGetLast,int maxAngle,
          bool shouldCheckDists)

{
  _InputArray local_108;
  _InputArray local_f0 [8];
  
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&this->contour,contour);
  (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->border).width = 0;
  (this->border).height = 0;
  (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->defects).super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->border).x = 0;
  (this->border).y = 0;
  (this->defects).super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->defects).super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hullI).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->hullI).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->hull).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->hullI).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->hull).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hull).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cv::Moments::Moments(&this->moment);
  (this->center).x = -1;
  (this->center).y = -1;
  (this->areaLimits).width = 0x9c4;
  (this->areaLimits).height = 640000;
  this->maxFingers = 5;
  this->maxAspectRatio = 4;
  this->maxAngle = maxAngle;
  this->minFTDist = 10;
  Finger::Finger(&this->higherFinger);
  Finger::Finger(&this->farthestFinger);
  this->ok = false;
  this->shouldCheckSize = shouldCheckSize;
  this->shouldCheckAngles = shouldCheckAngles;
  this->shouldCheckDists = shouldCheckDists;
  this->shouldGetLast = shouldGetLast;
  this->filtersIndex = -1;
  local_108.sz.width = 0;
  local_108.sz.height = 0;
  local_108.flags = -0x7efcfff4;
  local_108.obj = contour;
  cv::moments(local_f0,SUB81(&local_108,0));
  memcpy(&this->moment,local_f0,0xc0);
  this->area = *(double *)&this->moment;
  local_f0[0].sz.width = 0;
  local_f0[0].sz.height = 0;
  local_f0[0].flags = -0x7efcfff4;
  local_f0[0].obj = contour;
  cv::boundingRect(&local_108);
  (this->border).x = local_108.flags;
  (this->border).y = local_108._4_4_;
  (this->border).width = (int)local_108.obj;
  (this->border).height = local_108.obj._4_4_;
  return;
}

Assistant:

Hand::Hand(vector<Point> contour, bool shouldCheckSize, bool shouldCheckAngles,
           bool shouldGetLast, int maxAngle, bool shouldCheckDists)
        : contour(contour), shouldCheckSize(shouldCheckSize), shouldCheckAngles(shouldCheckAngles),
          shouldGetLast(shouldGetLast), maxAngle(maxAngle), shouldCheckDists(shouldCheckDists) {
    moment = moments(contour);
    area = moment.m00;
    border = boundingRect(contour);
}